

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

Glyph * __thiscall
sf::Font::loadGlyph(Font *this,Uint32 codePoint,uint characterSize,bool bold,float outlineThickness)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  bool bVar4;
  value_type vVar5;
  int iVar6;
  int iVar7;
  uint *puVar8;
  ostream *poVar9;
  reference pvVar10;
  uint in_ECX;
  reference pvVar11;
  uint in_EDX;
  Font *in_RSI;
  Glyph *in_RDI;
  byte in_R8B;
  float in_XMM0_Da;
  IntRect IVar12;
  Font *unaff_retaddr;
  uint h;
  uint w;
  uint y;
  uint x;
  size_t index_1;
  uint x_2;
  uint y_2;
  size_t index;
  uint x_1;
  uint y_1;
  Uint8 *pixels;
  Uint8 *end;
  Uint8 *current;
  Font *in_stack_00000070;
  Page *page;
  uint padding;
  uint height;
  uint width;
  FT_Bitmap *bitmap;
  FT_BitmapGlyph bitmapGlyph;
  FT_Stroker stroker;
  FT_OutlineGlyph outlineGlyph;
  bool outline;
  FT_Pos weight;
  FT_Glyph glyphDesc;
  FT_Int32 flags;
  FT_Face_conflict face;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  Glyph *pGVar13;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  uint in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  ulong in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  Texture *this_00;
  reference local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  long local_30;
  undefined4 local_24;
  void *local_20;
  float local_18;
  byte local_11;
  Font *page_00;
  
  local_11 = in_R8B & 1;
  pGVar13 = in_RDI;
  local_18 = in_XMM0_Da;
  page_00 = in_RSI;
  Glyph::Glyph((Glyph *)CONCAT17(in_stack_ffffffffffffff17,
                                 CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
  local_20 = in_RSI->m_face;
  if ((local_20 != (void *)0x0) &&
     (bVar4 = setCurrentSize(in_RSI,(uint)((ulong)pGVar13 >> 0x20)), bVar4)) {
    local_24 = 0x20;
    if ((local_18 != 0.0) || (NAN(local_18))) {
      local_24 = 0x28;
    }
    iVar6 = FT_Load_Char(local_20,in_EDX,local_24);
    if ((iVar6 == 0) &&
       (iVar6 = FT_Get_Glyph(*(undefined8 *)((long)local_20 + 0x98),&local_30), iVar6 == 0)) {
      bVar4 = *(int *)(local_30 + 0x10) == 0x6f75746c;
      if (bVar4) {
        if ((local_11 & 1) != 0) {
          FT_Outline_Embolden(local_30 + 0x28,0x40);
        }
        if ((local_18 != 0.0) || (NAN(local_18))) {
          pvVar2 = in_RSI->m_stroker;
          FT_Stroker_Set(pvVar2,(long)(local_18 * 64.0),1,0,0);
          FT_Glyph_Stroke(&local_30,pvVar2,1);
        }
      }
      FT_Glyph_To_Bitmap(&local_30,0,0,1);
      lVar3 = local_30;
      puVar8 = (uint *)(local_30 + 0x30);
      if (!bVar4) {
        if ((local_11 & 1) != 0) {
          FT_Bitmap_Embolden(in_RSI->m_library,puVar8,0x40,0x40);
        }
        if ((local_18 != 0.0) || (NAN(local_18))) {
          poVar9 = err();
          poVar9 = std::operator<<(poVar9,"Failed to outline glyph (no fallback available)");
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        }
      }
      in_RDI->advance = (float)(*(long *)(lVar3 + 0x18) >> 0x10);
      if ((local_11 & 1) != 0) {
        in_RDI->advance = in_RDI->advance + 1.0;
      }
      in_RDI->lsbDelta = (int)*(undefined8 *)(*(long *)((long)local_20 + 0x98) + 0x110);
      in_RDI->rsbDelta = (int)*(undefined8 *)(*(long *)((long)local_20 + 0x98) + 0x118);
      iVar6 = *(int *)(lVar3 + 0x34);
      uVar1 = *puVar8;
      if ((iVar6 != 0) && (uVar1 != 0)) {
        iVar7 = iVar6 + 4;
        loadPage(in_stack_00000070,current._4_4_);
        IVar12 = findGlyphRect(unaff_retaddr,(Page *)page_00,in_EDX,in_ECX);
        local_88 = IVar12._0_8_;
        uStack_80 = IVar12._8_8_;
        (in_RDI->textureRect).left = (undefined4)local_88;
        (in_RDI->textureRect).top = local_88._4_4_;
        (in_RDI->textureRect).width = (undefined4)uStack_80;
        (in_RDI->textureRect).height = uStack_80._4_4_;
        (in_RDI->textureRect).left = (in_RDI->textureRect).left + 2;
        (in_RDI->textureRect).top = (in_RDI->textureRect).top + 2;
        (in_RDI->textureRect).width = (in_RDI->textureRect).width + -4;
        (in_RDI->textureRect).height = (in_RDI->textureRect).height + -4;
        (in_RDI->bounds).left = (float)*(int *)(lVar3 + 0x28);
        (in_RDI->bounds).top = (float)-*(int *)(lVar3 + 0x2c);
        (in_RDI->bounds).width = (float)*(uint *)(lVar3 + 0x34);
        (in_RDI->bounds).height = (float)*puVar8;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),(size_type)in_RSI);
        local_90 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&in_RSI->m_pixelBuffer,0);
        pvVar10 = local_90 + iVar7 * (uVar1 + 4) * 4;
        while (local_90 != pvVar10) {
          *local_90 = 0xff;
          local_90[1] = 0xff;
          pvVar11 = local_90 + 3;
          local_90[2] = 0xff;
          local_90 = local_90 + 4;
          *pvVar11 = '\0';
        }
        this_00 = *(Texture **)(lVar3 + 0x40);
        if (*(char *)(lVar3 + 0x4a) == '\x01') {
          for (in_stack_ffffffffffffff5c = 2; in_stack_ffffffffffffff5c < uVar1 + 2;
              in_stack_ffffffffffffff5c = in_stack_ffffffffffffff5c + 1) {
            for (in_stack_ffffffffffffff58 = 2; in_stack_ffffffffffffff58 < iVar6 + 2U;
                in_stack_ffffffffffffff58 = in_stack_ffffffffffffff58 + 1) {
              in_stack_ffffffffffffff50 =
                   (ulong)(in_stack_ffffffffffffff58 + in_stack_ffffffffffffff5c * iVar7);
              vVar5 = '\0';
              if (((uint)*(byte *)((long)&(this_00->m_size).x +
                                  (ulong)(in_stack_ffffffffffffff58 - 2 >> 3)) &
                  1 << (7 - ((char)in_stack_ffffffffffffff58 - 2U & 7) & 0x1f)) != 0) {
                vVar5 = 0xff;
              }
              pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  (&in_RSI->m_pixelBuffer,in_stack_ffffffffffffff50 * 4 + 3);
              *pvVar10 = vVar5;
            }
            this_00 = (Texture *)((long)&(this_00->m_size).x + (long)*(int *)(lVar3 + 0x38));
          }
        }
        else {
          for (in_stack_ffffffffffffff4c = 2; in_stack_ffffffffffffff4c < uVar1 + 2;
              in_stack_ffffffffffffff4c = in_stack_ffffffffffffff4c + 1) {
            for (in_stack_ffffffffffffff48 = 2; in_stack_ffffffffffffff48 < iVar6 + 2U;
                in_stack_ffffffffffffff48 = in_stack_ffffffffffffff48 + 1) {
              vVar5 = *(value_type *)
                       ((long)&(this_00->m_size).x + (ulong)(in_stack_ffffffffffffff48 - 2));
              pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  (&in_RSI->m_pixelBuffer,
                                   (ulong)(in_stack_ffffffffffffff48 +
                                          in_stack_ffffffffffffff4c * iVar7) * 4 + 3);
              *pvVar10 = vVar5;
            }
            this_00 = (Texture *)((long)&(this_00->m_size).x + (long)*(int *)(lVar3 + 0x38));
          }
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                  (&in_RSI->m_pixelBuffer,0);
        Texture::update(this_00,(Uint8 *)CONCAT44(in_stack_ffffffffffffff5c,
                                                  in_stack_ffffffffffffff58),
                        (uint)(in_stack_ffffffffffffff50 >> 0x20),(uint)in_stack_ffffffffffffff50,
                        in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
      }
      FT_Done_Glyph(local_30);
    }
  }
  return pGVar13;
}

Assistant:

Glyph Font::loadGlyph(Uint32 codePoint, unsigned int characterSize, bool bold, float outlineThickness) const
{
    // The glyph to return
    Glyph glyph;

    // First, transform our ugly void* to a FT_Face
    FT_Face face = static_cast<FT_Face>(m_face);
    if (!face)
        return glyph;

    // Set the character size
    if (!setCurrentSize(characterSize))
        return glyph;

    // Load the glyph corresponding to the code point
    FT_Int32 flags = FT_LOAD_TARGET_NORMAL | FT_LOAD_FORCE_AUTOHINT;
    if (outlineThickness != 0)
        flags |= FT_LOAD_NO_BITMAP;
    if (FT_Load_Char(face, codePoint, flags) != 0)
        return glyph;

    // Retrieve the glyph
    FT_Glyph glyphDesc;
    if (FT_Get_Glyph(face->glyph, &glyphDesc) != 0)
        return glyph;

    // Apply bold and outline (there is no fallback for outline) if necessary -- first technique using outline (highest quality)
    FT_Pos weight = 1 << 6;
    bool outline = (glyphDesc->format == FT_GLYPH_FORMAT_OUTLINE);
    if (outline)
    {
        if (bold)
        {
            FT_OutlineGlyph outlineGlyph = reinterpret_cast<FT_OutlineGlyph>(glyphDesc);
            FT_Outline_Embolden(&outlineGlyph->outline, weight);
        }

        if (outlineThickness != 0)
        {
            FT_Stroker stroker = static_cast<FT_Stroker>(m_stroker);

            FT_Stroker_Set(stroker, static_cast<FT_Fixed>(outlineThickness * static_cast<float>(1 << 6)), FT_STROKER_LINECAP_ROUND, FT_STROKER_LINEJOIN_ROUND, 0);
            FT_Glyph_Stroke(&glyphDesc, stroker, true);
        }
    }

    // Convert the glyph to a bitmap (i.e. rasterize it)
    // Warning! After this line, do not read any data from glyphDesc directly, use
    // bitmapGlyph.root to access the FT_Glyph data.
    FT_Glyph_To_Bitmap(&glyphDesc, FT_RENDER_MODE_NORMAL, 0, 1);
    FT_BitmapGlyph bitmapGlyph = reinterpret_cast<FT_BitmapGlyph>(glyphDesc);
    FT_Bitmap& bitmap = bitmapGlyph->bitmap;

    // Apply bold if necessary -- fallback technique using bitmap (lower quality)
    if (!outline)
    {
        if (bold)
            FT_Bitmap_Embolden(static_cast<FT_Library>(m_library), &bitmap, weight, weight);

        if (outlineThickness != 0)
            err() << "Failed to outline glyph (no fallback available)" << std::endl;
    }

    // Compute the glyph's advance offset
    glyph.advance = static_cast<float>(bitmapGlyph->root.advance.x >> 16);
    if (bold)
        glyph.advance += static_cast<float>(weight) / static_cast<float>(1 << 6);

    glyph.lsbDelta = static_cast<int>(face->glyph->lsb_delta);
    glyph.rsbDelta = static_cast<int>(face->glyph->rsb_delta);

    unsigned int width  = bitmap.width;
    unsigned int height = bitmap.rows;

    if ((width > 0) && (height > 0))
    {
        // Leave a small padding around characters, so that filtering doesn't
        // pollute them with pixels from neighbors
        const unsigned int padding = 2;

        width += 2 * padding;
        height += 2 * padding;

        // Get the glyphs page corresponding to the character size
        Page& page = loadPage(characterSize);

        // Find a good position for the new glyph into the texture
        glyph.textureRect = findGlyphRect(page, width, height);

        // Make sure the texture data is positioned in the center
        // of the allocated texture rectangle
        glyph.textureRect.left   += static_cast<int>(padding);
        glyph.textureRect.top    += static_cast<int>(padding);
        glyph.textureRect.width  -= static_cast<int>(2 * padding);
        glyph.textureRect.height -= static_cast<int>(2 * padding);

        // Compute the glyph's bounding box
        glyph.bounds.left   = static_cast<float>( bitmapGlyph->left);
        glyph.bounds.top    = static_cast<float>(-bitmapGlyph->top);
        glyph.bounds.width  = static_cast<float>( bitmap.width);
        glyph.bounds.height = static_cast<float>( bitmap.rows);

        // Resize the pixel buffer to the new size and fill it with transparent white pixels
        m_pixelBuffer.resize(width * height * 4);

        Uint8* current = &m_pixelBuffer[0];
        Uint8* end = current + width * height * 4;

        while (current != end)
        {
            (*current++) = 255;
            (*current++) = 255;
            (*current++) = 255;
            (*current++) = 0;
        }

        // Extract the glyph's pixels from the bitmap
        const Uint8* pixels = bitmap.buffer;
        if (bitmap.pixel_mode == FT_PIXEL_MODE_MONO)
        {
            // Pixels are 1 bit monochrome values
            for (unsigned int y = padding; y < height - padding; ++y)
            {
                for (unsigned int x = padding; x < width - padding; ++x)
                {
                    // The color channels remain white, just fill the alpha channel
                    std::size_t index = x + y * width;
                    m_pixelBuffer[index * 4 + 3] = ((pixels[(x - padding) / 8]) & (1 << (7 - ((x - padding) % 8)))) ? 255 : 0;
                }
                pixels += bitmap.pitch;
            }
        }
        else
        {
            // Pixels are 8 bits gray levels
            for (unsigned int y = padding; y < height - padding; ++y)
            {
                for (unsigned int x = padding; x < width - padding; ++x)
                {
                    // The color channels remain white, just fill the alpha channel
                    std::size_t index = x + y * width;
                    m_pixelBuffer[index * 4 + 3] = pixels[x - padding];
                }
                pixels += bitmap.pitch;
            }
        }

        // Write the pixels to the texture
        unsigned int x = static_cast<unsigned int>(glyph.textureRect.left) - padding;
        unsigned int y = static_cast<unsigned int>(glyph.textureRect.top) - padding;
        unsigned int w = static_cast<unsigned int>(glyph.textureRect.width) + 2 * padding;
        unsigned int h = static_cast<unsigned int>(glyph.textureRect.height) + 2 * padding;
        page.texture.update(&m_pixelBuffer[0], w, h, x, y);
    }

    // Delete the FT glyph
    FT_Done_Glyph(glyphDesc);

    // Done :)
    return glyph;
}